

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
StringInstance::op_popBack
          (StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  size_type sVar2;
  undefined8 *puVar3;
  long lVar4;
  char *pcVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  string *this_00;
  char back;
  string *this_01;
  undefined4 in_stack_ffffffffffffff38;
  allocator local_91;
  string local_90 [32];
  string local_70 [32];
  string local_50 [35];
  char local_2d;
  allocator local_19 [25];
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 != 0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"null",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else {
    this_00 = (string *)(in_RSI + 0x58);
    std::__cxx11::string::size();
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)this_00);
    local_2d = *pcVar5;
    std::__cxx11::string::size();
    this_01 = local_50;
    std::__cxx11::string::substr((ulong)this_01,(ulong)this_00);
    std::__cxx11::string::operator=(this_00,this_01);
    std::__cxx11::string::~string(this_01);
    iVar1 = (int)local_2d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,1,(char)iVar1,&local_91);
    std::operator+((char *)CONCAT44(iVar1,in_stack_ffffffffffffff38),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar1,in_stack_ffffffffffffff38),(char *)this_01);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  return in_RDI;
}

Assistant:

std::string StringInstance::op_popBack(const std::vector<std::string>& arguments) {
    if (arguments.size() != 0)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (_value.size() == 0)
        return "null";
    char back = _value[int(_value.size()) - 1];
    _value = _value.substr(0, int(_value.size()) - 1);
    return "'" + std::string(1, back) + "'";
}